

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

void smtp_state(Curl_easy *data,smtpstate newstate)

{
  connectdata *pcVar1;
  smtp_conn *smtpc;
  smtpstate newstate_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  if (((((pcVar1->proto).smtpc.state != newstate) && (data != (Curl_easy *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
     ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
      (0 < Curl_trc_feat_smtp.log_level)))) {
    Curl_trc_smtp(data,"state change from %s to %s",smtp_state::names[(pcVar1->proto).smtpc.state],
                  smtp_state::names[newstate]);
  }
  (pcVar1->proto).smtpc.state = newstate;
  return;
}

Assistant:

static void smtp_state(struct Curl_easy *data, smtpstate newstate)
{
  struct smtp_conn *smtpc = &data->conn->proto.smtpc;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
  /* for debug purposes */
  static const char * const names[] = {
    "STOP",
    "SERVERGREET",
    "EHLO",
    "HELO",
    "STARTTLS",
    "UPGRADETLS",
    "AUTH",
    "COMMAND",
    "MAIL",
    "RCPT",
    "DATA",
    "POSTDATA",
    "QUIT",
    /* LAST */
  };

  if(smtpc->state != newstate)
    CURL_TRC_SMTP(data, "state change from %s to %s",
                  names[smtpc->state], names[newstate]);
#endif

  smtpc->state = newstate;
}